

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_string.h
# Opt level: O0

int JetHead::split<std::__cxx11::string>
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
              char *split_chars,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *parts)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  uint local_28;
  uint local_24;
  uint start;
  uint pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *parts_local;
  char *split_chars_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  
  _start = parts;
  parts_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)split_chars;
  split_chars_local = (char *)str;
  local_24 = std::__cxx11::string::find_first_of((char *)str,(ulong)split_chars);
  local_28 = 0;
  while (this = _start, (ulong)local_24 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)split_chars_local);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    local_28 = local_24 + 1;
    local_24 = std::__cxx11::string::find_first_of(split_chars_local,(ulong)parts_local);
    while (local_24 == local_28) {
      local_28 = local_24 + 1;
      local_24 = std::__cxx11::string::find_first_of(split_chars_local,(ulong)parts_local);
    }
  }
  std::__cxx11::string::substr((ulong)&local_78,(ulong)split_chars_local);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push_back(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  uVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          size(_start);
  return uVar1;
}

Assistant:

int	split( const _string &str, const char *split_chars, JetHead::vector<_string> &parts )
	{
		unsigned pos = str.find_first_of( split_chars );
		unsigned start = 0;
		
		while ( pos != _string::npos )
		{
			parts.push_back( str.substr( start, pos - start ) );
			
			start = pos + 1;
			pos = str.find_first_of( split_chars, start );
			
			// if next char is also in split_chars, then search until we find a 
			//  char that is not.
			while( pos == start )
			{
				start = pos + 1;
				pos = str.find_first_of( split_chars, start );
			}
		}
		
		parts.push_back( str.substr( start, pos - start ) );
		
		return parts.size();
	}